

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int load_ge(secp256k1_ge *ge,uint8_t *data,size_t len)

{
  long in_RDX;
  char *in_RSI;
  secp256k1_ge *unaff_retaddr;
  size_t in_stack_00000058;
  uchar *in_stack_00000060;
  secp256k1_ge *in_stack_00000068;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((in_RDX == 0x21) && ((*in_RSI == '\b' || (*in_RSI == '\t')))) {
    pedersen_commitment_load
              (unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    iVar1 = 1;
  }
  else {
    iVar1 = secp256k1_eckey_pubkey_parse(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  return iVar1;
}

Assistant:

static int load_ge(secp256k1_ge *ge, const uint8_t *data, size_t len)
{
    if (len == 33 && (data[0] == 0x08 || data[0] == 0x09)) {
        pedersen_commitment_load(ge, data);
        return 1;
    }
    return secp256k1_eckey_pubkey_parse(ge, data, len);
}